

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

AmpIO * SelectBoard(string *portName,vector<AmpIO_*,_std::allocator<AmpIO_*>_> *boardList,
                   AmpIO *curBoard)

{
  pointer ppAVar1;
  AmpIO *pAVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  if (8 < (ulong)((long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                       super__Vector_impl_data._M_start)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Select ",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(portName->_M_dataplus)._M_p,
                        portName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Board: ",8);
    if ((boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      uVar8 = 0;
      do {
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)(boardList->
                                     super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(boardList->
                                     super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"(any other key to keep current board ",0x25);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = getchar();
    uVar6 = iVar3 - 0x30U;
    if (9 < iVar3 - 0x30U) {
      if (iVar3 - 0x61U < 6) {
        uVar6 = iVar3 - 0x57;
      }
      else {
        uVar6 = 0xffffffff;
        if (iVar3 - 0x41U < 6) {
          uVar6 = iVar3 - 0x37;
        }
      }
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    if (-1 < (int)uVar6) {
      ppAVar1 = (boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = (long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppAVar1;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 3;
        lVar7 = 0;
        do {
          pAVar2 = ppAVar1[lVar7];
          if (uVar6 == (pAVar2->super_FpgaIO).super_BoardIO.BoardId) {
            return pAVar2;
          }
          lVar7 = lVar7 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
      }
    }
  }
  return curBoard;
}

Assistant:

AmpIO *SelectBoard(const std::string &portName, std::vector<AmpIO *> boardList, AmpIO *curBoard)
{
    AmpIO *newBoard = curBoard;
    if (boardList.size() > 1) {
        size_t i;
        std::cout << "Select " << portName << " Board: ";
        for (i = 0; i < boardList.size(); i++)
            std::cout << std::hex << static_cast<unsigned int>(boardList[i]->GetBoardId()) << " ";
        std::cout << "(any other key to keep current board " << std::hex << static_cast<unsigned int>(curBoard->GetBoardId())
                  << std::dec << ")" << std::endl;
        int num = getchar();
        if ((num >= '0') && (num <= '9')) num -= '0';
        else if ((num >= 'a') && (num <= 'f')) num = 10 + (num - 'a');
        else if ((num >= 'A') && (num <= 'F')) num = 10 + (num - 'A');
        else num = -1;
        std::cout << std::endl;
        if (num >= 0) {
            for (i = 0; i < boardList.size(); i++) {
                if (num == boardList[i]->GetBoardId()) {
                    newBoard = boardList[i];
                    break;
                }
            }
        }
    }
    return newBoard;
}